

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkqsort.c
# Opt level: O1

void mkqsort(uchar **a,int n,int depth)

{
  uchar **ppuVar1;
  byte bVar2;
  undefined8 uVar3;
  ulong uVar4;
  uchar **ppuVar5;
  uchar **ppuVar6;
  uchar **ppuVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  uchar **c;
  uchar *puVar11;
  long lVar12;
  byte bVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  
  uVar17 = (ulong)(uint)n;
LAB_001d512b:
  uVar8 = (uint)uVar17;
  if ((int)uVar8 < 0x14) {
    inssort(a,uVar8,depth);
    return;
  }
  ppuVar6 = a + (uVar17 >> 1 & 0x7fffffff);
  uVar4 = uVar17 & 0xffffffff;
  c = a + (uVar4 - 1);
  ppuVar7 = c;
  ppuVar5 = a;
  if (0x1e < (int)uVar8) {
    uVar17 = (ulong)(uVar8 & 0xfffffff8);
    uVar16 = (ulong)(uVar8 >> 2 & 0xfffffffe);
    ppuVar5 = med3func(a,(uchar **)((long)a + uVar17),a + uVar16,depth);
    ppuVar6 = med3func((uchar **)((long)ppuVar6 - uVar17),ppuVar6,(uchar **)((long)ppuVar6 + uVar17)
                       ,depth);
    ppuVar7 = med3func(c + -uVar16,(uchar **)((long)c - uVar17),c,depth);
  }
  ppuVar6 = med3func(ppuVar5,ppuVar6,ppuVar7,depth);
  puVar11 = *a;
  *a = *ppuVar6;
  *ppuVar6 = puVar11;
  bVar2 = (*a)[depth];
  ppuVar6 = a + 1;
  ppuVar7 = c;
  ppuVar5 = ppuVar6;
  do {
    for (; ppuVar6 <= ppuVar7; ppuVar6 = ppuVar6 + 1) {
      bVar13 = (*ppuVar6)[depth];
      if (bVar2 < bVar13) break;
      if (bVar13 == bVar2) {
        puVar11 = *ppuVar5;
        *ppuVar5 = *ppuVar6;
        *ppuVar6 = puVar11;
        ppuVar5 = ppuVar5 + 1;
      }
    }
    if (ppuVar7 < ppuVar6) break;
    puVar11 = *ppuVar7;
    bVar13 = puVar11[depth];
    while (bVar2 <= bVar13) {
      if (bVar13 == bVar2) {
        *ppuVar7 = *c;
        *c = puVar11;
        c = c + -1;
      }
      ppuVar1 = ppuVar7 + -1;
      if (ppuVar1 < ppuVar6) {
        ppuVar7 = ppuVar7 + -1;
        goto LAB_001d5284;
      }
      puVar11 = *ppuVar1;
      ppuVar7 = ppuVar1;
      bVar13 = puVar11[depth];
    }
    if (ppuVar7 < ppuVar6) break;
    puVar11 = *ppuVar6;
    *ppuVar6 = *ppuVar7;
    *ppuVar7 = puVar11;
    ppuVar6 = ppuVar6 + 1;
    ppuVar7 = ppuVar7 + -1;
  } while( true );
LAB_001d5284:
  lVar10 = (long)ppuVar5 - (long)a >> 3;
  lVar12 = (long)ppuVar6 - (long)ppuVar5 >> 3;
  if (lVar12 <= lVar10) {
    lVar10 = lVar12;
  }
  uVar8 = (uint)lVar10;
  if (0 < (int)uVar8) {
    iVar9 = uVar8 + 1;
    lVar10 = 0;
    do {
      uVar3 = *(undefined8 *)((long)a + lVar10);
      *(undefined8 *)((long)a + lVar10) =
           *(undefined8 *)((long)ppuVar6 + lVar10 + (ulong)(uVar8 & 0x7fffffff) * -8);
      *(undefined8 *)((long)ppuVar6 + lVar10 + (ulong)(uVar8 & 0x7fffffff) * -8) = uVar3;
      lVar10 = lVar10 + 8;
      iVar9 = iVar9 + -1;
    } while (1 < iVar9);
  }
  uVar17 = (long)c - (long)ppuVar7 >> 3;
  lVar10 = (long)((long)a + (uVar4 * 8 - (long)c)) >> 3;
  uVar15 = (uint)uVar17;
  uVar8 = (int)lVar10 - 1;
  if ((long)uVar17 < lVar10) {
    uVar8 = uVar15;
  }
  if (0 < (int)uVar8) {
    lVar10 = (ulong)(uVar8 & 0x7fffffff) * -8 + uVar4 * 8;
    iVar9 = uVar8 + 1;
    lVar14 = 0;
    do {
      uVar3 = *(undefined8 *)((long)ppuVar6 + lVar14);
      *(undefined8 *)((long)ppuVar6 + lVar14) = *(undefined8 *)((long)a + lVar14 + lVar10);
      *(undefined8 *)((long)a + lVar14 + lVar10) = uVar3;
      lVar14 = lVar14 + 8;
      iVar9 = iVar9 + -1;
    } while (1 < iVar9);
  }
  if (1 < (int)lVar12) {
    mkqsort(a,(int)lVar12,depth);
  }
  iVar9 = (int)((ulong)((long)ppuVar6 - (long)ppuVar5) >> 3);
  if (a[iVar9][depth] != '\0') {
    mkqsort(a + iVar9,(int)((long)a + ((((long)ppuVar5 - (long)a) + uVar4 * 8) - (long)c) >> 3) + -1
            ,depth + 1);
  }
  if ((int)uVar15 < 2) {
    return;
  }
  a = a + (uVar4 - (uVar15 & 0x7fffffff));
  goto LAB_001d512b;
}

Assistant:

void mkqsort(unsigned char **a, int n, int depth)
{   int d, r, partval;
    unsigned char **pa, **pb, **pc, **pd, **pl, **pm, **pn, *t;
    if (n < 20) {
        inssort(a, n, depth);
        return;
    }
    pl = a;
    pm = a + (n/2);
    pn = a + (n-1);
    if (n > 30) { /* On big arrays, pseudomedian of 9 */
        d = (n/8);
        pl = med3(pl, pl+d, pl+2*d);
        pm = med3(pm-d, pm, pm+d);
        pn = med3(pn-2*d, pn-d, pn);
    }
    pm = med3(pl, pm, pn);
    swap2(a, pm);
    partval = ptr2char(a);
    pa = pb = a + 1;
    pc = pd = a + n-1;
    for (;;) {
        while (pb <= pc && (r = ptr2char(pb)-partval) <= 0) {
            if (r == 0) { swap2(pa, pb); pa++; }
            pb++;
        }
        while (pb <= pc && (r = ptr2char(pc)-partval) >= 0) {
            if (r == 0) { swap2(pc, pd); pd--; }
            pc--;
       }
        if (pb > pc) break;
        swap2(pb, pc);
        pb++;
        pc--;
    }
    pn = a + n;
    r = min(pa-a, pb-pa);    vecswap2(a,  pb-r, r);
    r = min(pd-pc, pn-pd-1); vecswap2(pb, pn-r, r);
    if ((r = pb-pa) > 1)
        mkqsort(a, r, depth);
    if (ptr2char(a + r) != 0)
        mkqsort(a + r, pa-a + pn-pd-1, depth+1);
    if ((r = pd-pc) > 1)
        mkqsort(a + n-r, r, depth);
}